

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

void nn_sock_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_list_item *pnVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_ep *ep;
  nn_list_item *it;
  nn_sock *sock;
  nn_list_item *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  nn_list *in_stack_ffffffffffffffa0;
  long local_38;
  nn_list_item *local_28;
  
  local_38 = in_RDI;
  if (in_RDI == 0) {
    local_38 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    if (*(int *)(local_38 + 0x58) != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sock->state == NN_SOCK_STATE_ACTIVE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x353);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((*(uint *)(*(long *)(local_38 + 0x68) + 8) & 1) == 0) {
      nn_efd_stop((nn_efd *)0x124c34);
    }
    if ((*(uint *)(*(long *)(local_38 + 0x68) + 8) & 2) == 0) {
      nn_efd_stop((nn_efd *)0x124c59);
    }
    local_28 = nn_list_begin((nn_list *)(local_38 + 0x118));
    while (pnVar2 = nn_list_end((nn_list *)(local_38 + 0x118)), local_28 != pnVar2) {
      local_28 = nn_list_next((nn_list *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88);
      nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
      in_stack_ffffffffffffffa0 = (nn_list *)(local_38 + 0x128);
      nn_list_end((nn_list *)(local_38 + 0x128));
      nn_list_insert(in_stack_ffffffffffffffa0,
                     (nn_list_item *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                     (nn_list_item *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      nn_ep_stop((nn_ep *)0x124d46);
    }
    *(undefined4 *)(local_38 + 0x58) = 3;
  }
  else {
    if (*(int *)(local_38 + 0x58) != 3) {
      if (*(int *)(local_38 + 0x58) != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
                (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x39b);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_ESI != 0xfffffffe || in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "src == NN_FSM_ACTION && type == NN_SOCK_ACTION_STOPPED",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x38c);
        fflush(_stderr);
        nn_err_abort();
      }
      goto LAB_00124f21;
    }
    if (in_ESI != 1) {
      return;
    }
    if (in_EDX != 1) {
      return;
    }
    nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff88);
    nn_ep_term((nn_ep *)0x124db7);
    nn_free((void *)0x124dc1);
  }
  iVar1 = nn_list_empty((nn_list *)(local_38 + 0x128));
  if (iVar1 == 0) {
    return;
  }
  iVar1 = nn_list_empty((nn_list *)(local_38 + 0x118));
  if (iVar1 == 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_empty (&sock->eps)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
            ,0x381);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined4 *)(local_38 + 0x58) = 4;
  if (*(long *)**(undefined8 **)(local_38 + 0x60) != 0) {
    (**(code **)**(undefined8 **)(local_38 + 0x60))(*(undefined8 *)(local_38 + 0x60));
    return;
  }
LAB_00124f21:
  (**(code **)(**(long **)(local_38 + 0x60) + 8))(*(undefined8 *)(local_38 + 0x60));
  *(undefined4 *)(local_38 + 0x58) = 5;
  nn_sem_post((nn_sem *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

static void nn_sock_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sock *sock;
    struct nn_list_item *it;
    struct nn_ep *ep;

    sock = nn_cont (self, struct nn_sock, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_assert (sock->state == NN_SOCK_STATE_ACTIVE);

        /*  Close sndfd and rcvfd. This should make any current
            select/poll using SNDFD and/or RCVFD exit. */
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
            nn_efd_stop (&sock->rcvfd);
        }
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
            nn_efd_stop (&sock->sndfd);
        }

        /*  Ask all the associated endpoints to stop. */
        it = nn_list_begin (&sock->eps);
        while (it != nn_list_end (&sock->eps)) {
            ep = nn_cont (it, struct nn_ep, item);
            it = nn_list_next (&sock->eps, it);
            nn_list_erase (&sock->eps, &ep->item);
            nn_list_insert (&sock->sdeps, &ep->item,
                nn_list_end (&sock->sdeps));
            nn_ep_stop (ep);

        }
        sock->state = NN_SOCK_STATE_STOPPING_EPS;
        goto finish2;
    }
    if (nn_slow (sock->state == NN_SOCK_STATE_STOPPING_EPS)) {

        if (!(src == NN_SOCK_SRC_EP && type == NN_EP_STOPPED)) {
            /*  If we got here waiting for EPs to teardown, but src is
                not an EP, then it isn't safe for us to do anything,
                because we just need to wait for the EPs to finish
                up their thing.  Just bail. */
            return;
        }
        /*  Endpoint is stopped. Now we can safely deallocate it. */
        ep = (struct nn_ep*) srcptr;
        nn_list_erase (&sock->sdeps, &ep->item);
        nn_ep_term (ep);
        nn_free (ep);

finish2:
        /*  If all the endpoints are deallocated, we can start stopping
            protocol-specific part of the socket. If there' no stop function
            we can consider it stopped straight away. */
        if (!nn_list_empty (&sock->sdeps))
            return;
        nn_assert (nn_list_empty (&sock->eps));
        sock->state = NN_SOCK_STATE_STOPPING;
        if (!sock->sockbase->vfptr->stop)
            goto finish1;
        sock->sockbase->vfptr->stop (sock->sockbase);
        return;
    }
    if (nn_slow (sock->state == NN_SOCK_STATE_STOPPING)) {

        /*  We get here when the deallocation of the socket was delayed by the
            specific socket type. */
        nn_assert (src == NN_FSM_ACTION && type == NN_SOCK_ACTION_STOPPED);

finish1:
        /*  Protocol-specific part of the socket is stopped.
            We can safely deallocate it. */
        sock->sockbase->vfptr->destroy (sock->sockbase);
        sock->state = NN_SOCK_STATE_FINI;

        /*  Now we can unblock the application thread blocked in
            the nn_close() call. */
        nn_sem_post (&sock->termsem);

        return;
    }

    nn_fsm_bad_state(sock->state, src, type);
}